

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dragon.cpp
# Opt level: O3

int AF_A_DragonAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  PClassActor *type;
  AActor *source;
  char *__assertion;
  AActor *dest;
  bool bVar6;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005da810;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    source = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (source == (AActor *)0x0) {
LAB_005da704:
        source = (AActor *)0x0;
      }
      else {
        pPVar5 = (source->super_DThinker).super_DObject.Class;
        if (pPVar5 == (PClass *)0x0) {
          iVar4 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
          pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
          (source->super_DThinker).super_DObject.Class = pPVar5;
        }
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar6) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar6 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar6) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005da810;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam != 1) {
        VVar1 = param[1].field_0.field_3.Type;
        if (VVar1 != 0xff) {
          if (VVar1 != '\x03') goto LAB_005da800;
          puVar2 = (undefined8 *)param[1].field_0.field_1.a;
          if (param[1].field_0.field_1.atag == 1) {
            if (puVar2 != (undefined8 *)0x0) {
              pPVar5 = (PClass *)puVar2[1];
              if (pPVar5 == (PClass *)0x0) {
                pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2);
                puVar2[1] = pPVar5;
              }
              bVar6 = pPVar5 != (PClass *)0x0;
              if (pPVar5 != pPVar3 && bVar6) {
                do {
                  pPVar5 = pPVar5->ParentClass;
                  bVar6 = pPVar5 != (PClass *)0x0;
                  if (pPVar5 == pPVar3) break;
                } while (pPVar5 != (PClass *)0x0);
              }
              if (!bVar6) {
                __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
                goto LAB_005da810;
              }
            }
          }
          else if (puVar2 != (undefined8 *)0x0) goto LAB_005da800;
        }
        if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
           ((VVar1 != '\x03' ||
            ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0))))))
        {
          __assertion = 
          "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
          ;
          goto LAB_005da810;
        }
      }
      dest = (source->target).field_0.p;
      if (dest != (AActor *)0x0) {
        if (((dest->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005da7d9;
        (source->target).field_0.p = (AActor *)0x0;
      }
      dest = (AActor *)0x0;
LAB_005da7d9:
      type = PClass::FindActor("DragonFireball");
      P_SpawnMissile(source,dest,type,(AActor *)0x0);
      return 0;
    }
    if (source == (AActor *)0x0) goto LAB_005da704;
  }
LAB_005da800:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005da810:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_dragon.cpp"
                ,0xf1,"int AF_A_DragonAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DragonAttack)
{
	PARAM_ACTION_PROLOGUE;

	P_SpawnMissile (self, self->target, PClass::FindActor("DragonFireball"));
	return 0;
}